

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O0

void __thiscall license::FullLicenseInfo::toLicenseInfo(FullLicenseInfo *this,LicenseInfo *license)

{
  char *pcVar1;
  time_t __time1;
  time_t __time0;
  double dVar2;
  double secs;
  LicenseInfo *license_local;
  FullLicenseInfo *this_local;
  
  if (license != (LicenseInfo *)0x0) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    strncpy(license->proprietary_data,pcVar1,0x10);
    license->linked_to_pc = (bool)(this->has_client_sig & 1);
    license->has_expiry = (bool)(this->has_expiry & 1);
    if ((this->has_expiry & 1U) == 0) {
      license->expiry_date[0] = '\0';
      license->days_left = 999999;
    }
    else {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      strncpy(license->expiry_date,pcVar1,0xb);
      pcVar1 = (char *)std::__cxx11::string::c_str();
      __time1 = seconds_from_epoch(pcVar1);
      __time0 = time((time_t *)0x0);
      dVar2 = difftime(__time1,__time0);
      dVar2 = round(dVar2 / 86400.0);
      license->days_left = (uint)(long)dVar2;
    }
  }
  return;
}

Assistant:

void FullLicenseInfo::toLicenseInfo(LicenseInfo* license) const {
	if (license != NULL) {
		strncpy(license->proprietary_data, extra_data.c_str(),
		PROPRIETARY_DATA_SIZE);

		license->linked_to_pc = has_client_sig;
		license->has_expiry = has_expiry;
		if (!has_expiry) {
			license->expiry_date[0] = '\0';
			license->days_left = 999999;
		} else {
			strncpy(license->expiry_date, to_date.c_str(), 11);
			double secs = difftime(
				seconds_from_epoch(to_date.c_str()),
				time(NULL));
			license->days_left = round(secs / (60 * 60 * 24));
		}
	}
}